

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::EnumDescriptor::DebugString
          (EnumDescriptor *this,int depth,string *contents,DebugStringOptions *debug_string_options)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int i;
  int i_00;
  Edition EVar2;
  ushort *puVar3;
  FeatureSet *from;
  ReservedRange *pRVar4;
  atomic<google::protobuf::internal::ThreadSafeArena::SerialArenaChunk_*> aVar5;
  Nonnull<char_*> pcVar6;
  string *psVar7;
  SymbolVisibility *visibility;
  char *pcVar8;
  long lVar9;
  InternalMetadata arena;
  size_t in_R9;
  long lVar10;
  string_view format;
  string_view format_00;
  string_view format_01;
  string_view format_02;
  string_view format_03;
  string_view format_04;
  string_view src;
  string_view format_05;
  string_view format_06;
  string prefix;
  SourceLocationCommentPrinter comment_printer;
  EnumOptions full_options;
  string local_1c8;
  atomic<google::protobuf::internal::ThreadSafeArena::SerialArenaChunk_*> local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168 [2];
  undefined1 local_140 [120];
  _Alloc_hider local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90;
  EnumOptions local_88;
  
  psVar7 = &local_1c8;
  local_198._M_b._M_p = (__base_type)&local_188;
  std::__cxx11::string::_M_construct((ulong)&local_198,(char)depth * '\x02');
  local_140._24_8_ = local_140 + 0x28;
  local_140._32_8_ = 0;
  local_140[0x28] = '\0';
  local_140._56_8_ = local_140 + 0x48;
  local_140._64_8_ = 0;
  local_140[0x48] = '\0';
  local_140._88_8_ = (pointer)0x0;
  local_140._96_8_ = (pointer)0x0;
  local_140._104_8_ = (pointer)0x0;
  local_140[0x70] = debug_string_options->include_comments;
  local_140[0x71] = debug_string_options->elide_group_body;
  local_140[0x72] = debug_string_options->elide_oneof_body;
  local_c8._M_p = (pointer)&local_b8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c8,local_198._M_b._M_p,
             local_190->_M_local_buf + (long)local_198._M_b._M_p);
  if (debug_string_options->include_comments == true) {
    local_140[0] = GetSourceLocation(this,(SourceLocation *)(local_140 + 8));
  }
  else {
    local_140[0] = false;
  }
  anon_unknown_24::SourceLocationCommentPrinter::AddPreComment
            ((SourceLocationCommentPrinter *)local_140,contents);
  paVar1 = local_190;
  aVar5._M_b._M_p = local_198._M_b._M_p;
  (anonymous_namespace)::VisibilityToKeyword_abi_cxx11_
            (&local_1c8,(_anonymous_namespace_ *)(ulong)((byte)this->field_0x1 >> 2 & 3),visibility)
  ;
  puVar3 = (ushort *)(this->all_names_).payload_;
  local_88.field_0._18_6_ = 0;
  local_88.field_0._16_2_ = *puVar3;
  local_88.super_Message.super_MessageLite._vptr_MessageLite = (_func_int **)paVar1;
  local_88.super_Message.super_MessageLite._internal_metadata_.ptr_ = (intptr_t)aVar5._M_b._M_p;
  local_88.field_0._impl_._extensions_.arena_ = (Arena *)local_1c8._M_string_length;
  local_88.field_0._8_8_ = local_1c8._M_dataplus._M_p;
  local_88.field_0._24_8_ = (long)puVar3 + ~(ulong)local_88.field_0._impl_._extensions_.map_;
  format._M_str = (char *)&local_88;
  format._M_len = (size_t)"$0$1enum $2 {\n";
  absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
            ((substitute_internal *)contents,(Nonnull<std::string_*>)0xe,format,
             (Nullable<const_absl::string_view_*>)0x3,in_R9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  EnumOptions::EnumOptions(&local_88,(Arena *)0x0,this->options_);
  from = this->proto_features_;
  if (from != (FeatureSet *)_FeatureSet_default_instance_) {
    local_88.field_0._24_8_ = local_88.field_0._24_8_ | 1;
    if (local_88.field_0._impl_.features_ == (FeatureSet *)0x0) {
      arena.ptr_ = local_88.super_Message.super_MessageLite._internal_metadata_.ptr_;
      if ((local_88.super_Message.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
        arena.ptr_ = *(undefined8 *)
                      (local_88.super_Message.super_MessageLite._internal_metadata_.ptr_ &
                      0xfffffffffffffffe);
      }
      local_88.field_0._impl_.features_ =
           (FeatureSet *)Arena::DefaultConstruct<google::protobuf::FeatureSet>((Arena *)arena.ptr_);
    }
    FeatureSet::CopyFrom(local_88.field_0._impl_.features_,from);
  }
  anon_unknown_24::FormatLineOptions(depth + 1,&local_88.super_Message,this->file_->pool_,contents);
  if (0 < this->value_count_) {
    lVar9 = 0;
    lVar10 = 0;
    do {
      EnumValueDescriptor::DebugString
                ((EnumValueDescriptor *)(&this->values_->super_SymbolBaseN<0> + lVar9),depth + 1,
                 contents,debug_string_options);
      lVar10 = lVar10 + 1;
      lVar9 = lVar9 + 0x30;
    } while (lVar10 < this->value_count_);
  }
  if (0 < this->reserved_range_count_) {
    local_1c8._M_dataplus._M_p = (pointer)local_190;
    local_1c8._M_string_length = (size_type)local_198._M_b._M_p;
    format_00._M_str = (char *)&local_1c8;
    format_00._M_len = (size_t)"$0  reserved ";
    absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
              ((substitute_internal *)contents,(Nonnull<std::string_*>)0xd,format_00,
               (Nullable<const_absl::string_view_*>)0x1,in_R9);
    if (0 < this->reserved_range_count_) {
      lVar9 = 0;
      do {
        pRVar4 = this->reserved_ranges_;
        i = pRVar4[lVar9].start;
        i_00 = pRVar4[lVar9].end;
        if (i_00 == i) {
          paVar1 = &local_1c8.field_2;
          pcVar6 = absl::lts_20250127::numbers_internal::FastIntToBuffer(i_00,paVar1->_M_local_buf);
          local_1c8._M_dataplus._M_p = pcVar6 + -(long)paVar1;
          format_01._M_str = (char *)&local_178;
          format_01._M_len = (size_t)"$0, ";
          local_1c8._M_string_length = (size_type)paVar1;
          local_178 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1c8._M_dataplus._M_p;
          local_170 = paVar1;
          absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
                    ((substitute_internal *)contents,(Nonnull<std::string_*>)0x4,format_01,
                     (Nullable<const_absl::string_view_*>)0x1,in_R9);
        }
        else if (i_00 == 0x7fffffff) {
          paVar1 = &local_1c8.field_2;
          pcVar6 = absl::lts_20250127::numbers_internal::FastIntToBuffer(i,paVar1->_M_local_buf);
          local_1c8._M_dataplus._M_p = pcVar6 + -(long)paVar1;
          format_02._M_str = (char *)&local_178;
          format_02._M_len = (size_t)"$0 to max, ";
          local_1c8._M_string_length = (size_type)paVar1;
          local_178 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1c8._M_dataplus._M_p;
          local_170 = paVar1;
          absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
                    ((substitute_internal *)contents,(Nonnull<std::string_*>)0xb,format_02,
                     (Nullable<const_absl::string_view_*>)0x1,in_R9);
        }
        else {
          paVar1 = &local_1c8.field_2;
          pcVar6 = absl::lts_20250127::numbers_internal::FastIntToBuffer(i,paVar1->_M_local_buf);
          local_1c8._M_dataplus._M_p = pcVar6 + -(long)paVar1;
          local_1c8._M_string_length = (size_type)paVar1;
          pcVar6 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                             (pRVar4[lVar9].end,local_168[0]._M_local_buf);
          local_178 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(pcVar6 + -(long)local_168);
          local_a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_1c8._M_dataplus._M_p;
          paStack_a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_1c8._M_string_length;
          format_03._M_str = (char *)&local_a8;
          format_03._M_len = (size_t)"$0 to $1, ";
          local_170 = local_168;
          local_98 = local_178;
          local_90 = local_168;
          absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
                    ((substitute_internal *)contents,(Nonnull<std::string_*>)0xa,format_03,
                     (Nullable<const_absl::string_view_*>)0x2,in_R9);
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < this->reserved_range_count_);
    }
    std::__cxx11::string::replace
              ((ulong)contents,contents->_M_string_length - 2,(char *)0x2,0x2d98cb);
  }
  if (0 < this->reserved_name_count_) {
    local_1c8._M_dataplus._M_p = (pointer)local_190;
    local_1c8._M_string_length = (size_type)local_198._M_b._M_p;
    format_04._M_str = (char *)&local_1c8;
    format_04._M_len = (size_t)"$0  reserved ";
    absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
              ((substitute_internal *)contents,(Nonnull<std::string_*>)0xd,format_04,
               (Nullable<const_absl::string_view_*>)0x1,in_R9);
    if (0 < this->reserved_name_count_) {
      lVar9 = 0;
      do {
        EVar2 = this->file_->edition_;
        src._M_str = (char *)psVar7;
        src._M_len = (size_t)(this->reserved_names_[lVar9]->_M_dataplus)._M_p;
        absl::lts_20250127::CEscape_abi_cxx11_
                  (&local_1c8,(lts_20250127 *)this->reserved_names_[lVar9]->_M_string_length,src);
        pcVar8 = "$0, ";
        if ((int)EVar2 < 1000) {
          pcVar8 = "\"$0\", ";
        }
        local_178 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c8._M_string_length;
        local_170 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c8._M_dataplus._M_p;
        format_05._M_str = (char *)&local_178;
        format_05._M_len = (size_t)pcVar8;
        psVar7 = (string *)&local_178;
        absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
                  ((substitute_internal *)contents,
                   (Nonnull<std::string_*>)((ulong)((int)EVar2 < 1000) * 2 + 4),format_05,
                   (Nullable<const_absl::string_view_*>)0x1,in_R9);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < this->reserved_name_count_);
    }
    std::__cxx11::string::replace
              ((ulong)contents,contents->_M_string_length - 2,(char *)0x2,0x2d98cb);
  }
  local_1c8._M_dataplus._M_p = (pointer)local_190;
  local_1c8._M_string_length = (size_type)local_198._M_b._M_p;
  format_06._M_str = (char *)&local_1c8;
  format_06._M_len = (size_t)"$0}\n";
  absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
            ((substitute_internal *)contents,(Nonnull<std::string_*>)0x4,format_06,
             (Nullable<const_absl::string_view_*>)0x1,in_R9);
  anon_unknown_24::SourceLocationCommentPrinter::AddPostComment
            ((SourceLocationCommentPrinter *)local_140,contents);
  EnumOptions::~EnumOptions(&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_p != &local_b8) {
    operator_delete(local_c8._M_p,local_b8._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_140 + 0x58));
  if ((undefined1 *)local_140._56_8_ != local_140 + 0x48) {
    operator_delete((void *)local_140._56_8_,CONCAT71(local_140._73_7_,local_140[0x48]) + 1);
  }
  if ((undefined1 *)local_140._24_8_ != local_140 + 0x28) {
    operator_delete((void *)local_140._24_8_,CONCAT71(local_140._41_7_,local_140[0x28]) + 1);
  }
  if (local_198._M_b._M_p != (__pointer_type)&local_188) {
    operator_delete((void *)local_198._M_b._M_p,local_188._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void EnumDescriptor::DebugString(
    int depth, std::string* contents,
    const DebugStringOptions& debug_string_options) const {
  std::string prefix(depth * 2, ' ');
  ++depth;

  SourceLocationCommentPrinter comment_printer(this, prefix,
                                               debug_string_options);
  comment_printer.AddPreComment(contents);

  absl::SubstituteAndAppend(contents, "$0$1enum $2 {\n", prefix,
                            VisibilityToKeyword(visibility_keyword()), name());

  EnumOptions full_options = options();
  CopyFeaturesToOptions(proto_features_, &full_options);
  FormatLineOptions(depth, full_options, file()->pool(), contents);

  for (int i = 0; i < value_count(); i++) {
    value(i)->DebugString(depth, contents, debug_string_options);
  }

  if (reserved_range_count() > 0) {
    absl::SubstituteAndAppend(contents, "$0  reserved ", prefix);
    for (int i = 0; i < reserved_range_count(); i++) {
      const EnumDescriptor::ReservedRange* range = reserved_range(i);
      if (range->end == range->start) {
        absl::SubstituteAndAppend(contents, "$0, ", range->start);
      } else if (range->end == INT_MAX) {
        absl::SubstituteAndAppend(contents, "$0 to max, ", range->start);
      } else {
        absl::SubstituteAndAppend(contents, "$0 to $1, ", range->start,
                                  range->end);
      }
    }
    contents->replace(contents->size() - 2, 2, ";\n");
  }

  if (reserved_name_count() > 0) {
    absl::SubstituteAndAppend(contents, "$0  reserved ", prefix);
    for (int i = 0; i < reserved_name_count(); i++) {
      absl::SubstituteAndAppend(
          contents,
          file()->edition() < Edition::EDITION_2023 ? "\"$0\", " : "$0, ",
          absl::CEscape(reserved_name(i)));
    }
    contents->replace(contents->size() - 2, 2, ";\n");
  }

  absl::SubstituteAndAppend(contents, "$0}\n", prefix);

  comment_printer.AddPostComment(contents);
}